

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instructions_list.c
# Opt level: O3

void vpbroadcastd(PDISASM pMyDisasm)

{
  if ((((pMyDisasm->Reserved_).VEX.state == '\x01') && ((pMyDisasm->Reserved_).VEX.pp == '\x01')) &&
     ((pMyDisasm->Reserved_).EVEX.W == '\0')) {
    builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"vpbroadcastd",0xd);
    if ((pMyDisasm->Reserved_).VEX.vvvv != '\x0f') {
      (pMyDisasm->Reserved_).ERROR_OPCODE = 2;
    }
    if ((pMyDisasm->Reserved_).EVEX.state == '\x01') {
      (pMyDisasm->Reserved_).EVEX.tupletype = '\x06';
    }
    vex_GE(pMyDisasm,0x67,0x67,0x67,4,4,4);
    return;
  }
  builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"???",4);
  (pMyDisasm->Operand1).AccessMode = 0;
  (pMyDisasm->Operand2).AccessMode = 0;
  (pMyDisasm->Operand3).AccessMode = 0;
  (pMyDisasm->Operand4).AccessMode = 0;
  (pMyDisasm->Operand5).AccessMode = 0;
  (pMyDisasm->Operand6).AccessMode = 0;
  (pMyDisasm->Operand7).AccessMode = 0;
  (pMyDisasm->Operand8).AccessMode = 0;
  (pMyDisasm->Operand9).AccessMode = 0;
  (pMyDisasm->Reserved_).ERROR_OPCODE = -1;
  return;
}

Assistant:

void __bea_callspec__ vpbroadcastd(PDISASM pMyDisasm)
{
  if (GV.VEX.state == InUsePrefix) {
    if (GV.VEX.pp == 1) {
      if (GV.EVEX.W == 0) {
        #ifndef BEA_LIGHT_DISASSEMBLY
           (void) strcpy (pMyDisasm->Instruction.Mnemonic, "vpbroadcastd");
        #endif
        if (GV.VEX.vvvv != 15) GV.ERROR_OPCODE = UD_;
        if (GV.EVEX.state == InUsePrefix) GV.EVEX.tupletype = TUPLE1_SCALAR;
        vex_GE(pMyDisasm, Arg2dword, Arg2dword, Arg2dword, SSE_REG, SSE_REG, SSE_REG);
      }
      else {
        failDecode(pMyDisasm);
      }
    }
    else {
      failDecode(pMyDisasm);
    }
  }
  else {
    failDecode(pMyDisasm);
  }
}